

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestResult
               (ostream *stream,TestResult *result)

{
  TestPartResult *pTVar1;
  ostream *poVar2;
  int line;
  size_t in_RDX;
  size_t width;
  int i;
  internal *this;
  int iVar3;
  string kIndent;
  string location;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  Indent_abi_cxx11_(&kIndent,(internal *)0xa,in_RDX);
  i = 0;
  iVar3 = 0;
  while( true ) {
    line = 0x70;
    if ((int)(((long)(result->test_part_results_).
                     super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(result->test_part_results_).
                    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= i) break;
    pTVar1 = TestResult::GetTestPartResult(result,i);
    if (pTVar1->type_ - kNonFatalFailure < 2) {
      std::operator<<(stream,",\n");
      if (iVar3 == 0) {
        poVar2 = std::operator<<(stream,(string *)&kIndent);
        poVar2 = std::operator<<(poVar2,"\"");
        poVar2 = std::operator<<(poVar2,"failures");
        std::operator<<(poVar2,"\": [\n");
      }
      this = (internal *)(pTVar1->file_name_)._M_string_length;
      if (this != (internal *)0x0) {
        this = (internal *)(pTVar1->file_name_)._M_dataplus._M_p;
      }
      FormatCompilerIndependentFileLocation_abi_cxx11_
                (&location,this,(char *)(ulong)(uint)pTVar1->line_number_,line);
      std::operator+(&local_68,&location,"\n");
      std::operator+(&local_48,&local_68,(pTVar1->message_)._M_dataplus._M_p);
      EscapeJson(&message,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      poVar2 = std::operator<<(stream,(string *)&kIndent);
      poVar2 = std::operator<<(poVar2,"  {\n");
      poVar2 = std::operator<<(poVar2,(string *)&kIndent);
      poVar2 = std::operator<<(poVar2,"    \"failure\": \"");
      poVar2 = std::operator<<(poVar2,(string *)&message);
      poVar2 = std::operator<<(poVar2,"\",\n");
      poVar2 = std::operator<<(poVar2,(string *)&kIndent);
      poVar2 = std::operator<<(poVar2,"    \"type\": \"\"\n");
      poVar2 = std::operator<<(poVar2,(string *)&kIndent);
      std::operator<<(poVar2,"  }");
      iVar3 = iVar3 + 1;
      std::__cxx11::string::~string((string *)&message);
      std::__cxx11::string::~string((string *)&location);
    }
    i = i + 1;
  }
  if (0 < iVar3) {
    poVar2 = std::operator<<(stream,"\n");
    poVar2 = std::operator<<(poVar2,(string *)&kIndent);
    std::operator<<(poVar2,"]");
  }
  poVar2 = std::operator<<(stream,"\n");
  Indent_abi_cxx11_(&location,(internal *)0x8,width);
  poVar2 = std::operator<<(poVar2,(string *)&location);
  std::operator<<(poVar2,"}");
  std::__cxx11::string::~string((string *)&location);
  std::__cxx11::string::~string((string *)&kIndent);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestResult(::std::ostream* stream,
                                                     const TestResult& result) {
  const std::string kIndent = Indent(10);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      *stream << ",\n";
      if (++failures == 1) {
        *stream << kIndent << "\"" << "failures" << "\": [\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string message = EscapeJson(location + "\n" + part.message());
      *stream << kIndent << "  {\n"
              << kIndent << "    \"failure\": \"" << message << "\",\n"
              << kIndent << "    \"type\": \"\"\n"
              << kIndent << "  }";
    }
  }

  if (failures > 0)
    *stream << "\n" << kIndent << "]";
  *stream << "\n" << Indent(8) << "}";
}